

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GC.cpp
# Opt level: O0

void __thiscall luna::GC::MinorGC(GC *this)

{
  GC *in_RDI;
  uint alived_gen0_count;
  uint old_gen1_count;
  GC *in_stack_00000050;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar1;
  
  uVar1 = (in_RDI->gen1_).count_;
  MinorGCMark(in_stack_00000050);
  MinorGCSweep((GC *)CONCAT44(uVar1,in_stack_fffffffffffffff0));
  std::deque<luna::GCObject_*,_std::allocator<luna::GCObject_*>_>::clear
            ((deque<luna::GCObject_*,_std::allocator<luna::GCObject_*>_> *)this);
  AdjustThreshold(in_RDI,(in_RDI->gen1_).count_ - uVar1,&in_RDI->gen0_,0x200,0x800);
  return;
}

Assistant:

void GC::MinorGC()
    {
        unsigned int old_gen1_count = gen1_.count_;

        MinorGCMark();
        MinorGCSweep();

        barriered_.clear();

        // Caculate objects count from gen0_ to gen1_, which is how
        // many alived objects in gen0_ after mark-sweep, and adjust
        // gen0_'s threshold count by the alived_gen0_count
        unsigned int alived_gen0_count = gen1_.count_ - old_gen1_count;
        AdjustThreshold(alived_gen0_count, gen0_, kGen0InitThresholdCount,
                        kGen0MaxThresholdCount);
    }